

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

query_t * queryDatabase(int thread_index,int query_id,char *sql_command)

{
  int iVar1;
  query_t *pqVar2;
  size_t sVar3;
  code *pcVar4;
  char *pcVar5;
  sqlite3 *db;
  char *err_msg;
  undefined8 local_38;
  undefined8 local_30;
  
  pqVar2 = (query_t *)malloc(0x10);
  local_30 = 0;
  iVar1 = sqlite3_open(DATABASE,&local_38);
  if (iVar1 == 0) {
    if (query_id == 0) {
      pcVar4 = viewCallback;
LAB_001043d8:
      iVar1 = sqlite3_exec(local_38,sql_command,pcVar4,0,&local_30);
      printf("Thread #%d: Querying from database:\n   %s\n",(ulong)(uint)thread_index,sql_command);
      if (iVar1 != 0) {
        queryDatabase_cold_2();
        goto LAB_00104471;
      }
    }
    else {
      if (query_id == 1) {
        pcVar4 = busy_roomsCallback;
        goto LAB_001043d8;
      }
      if (query_id == 2) {
        pcVar4 = validEntryCallback;
        goto LAB_001043d8;
      }
      printf("Thread #%d: Querying from database:\n   %s\n",(ulong)(uint)thread_index,sql_command);
    }
    sqlite3_close(local_38);
    iVar1 = 0;
    if (query_id == 2) {
      pcVar5 = (char *)&entry_id_g;
    }
    else if (query_id == 1) {
      pcVar5 = rooms_busy_g;
    }
    else {
      if (query_id != 0) {
        return pqVar2;
      }
      pcVar5 = query_result_g;
      sVar3 = strlen(query_result_g);
      (&DAT_0010841f)[sVar3] = 0;
    }
  }
  else {
    queryDatabase_cold_1();
LAB_00104471:
    pcVar5 = "";
    iVar1 = -1;
  }
  pqVar2->rv = iVar1;
  pqVar2->query_result = pcVar5;
  return pqVar2;
}

Assistant:

query_t* 
queryDatabase(int thread_index, const int query_id, const char* sql_command) 
{
    
    query_t* query = (query_t*) malloc(sizeof(query_t)); // variable to be returned + its initialization


    sqlite3* db;
    char* err_msg = 0;
    
    int rc = sqlite3_open(DATABASE, &db);

    
    if (rc != SQLITE_OK) {
        fprintf(stderr, "Cannot open database:\n%s\n", sqlite3_errmsg(db));
        sqlite3_close(db);
        
        query->rv = -1;
        query->query_result = (void*)"";
        return query;
    }
    


    switch (query_id){
        case 0:
            rc = sqlite3_exec(db, sql_command, viewCallback, 0, &err_msg);
            break;
        
        case 1:
            rc = sqlite3_exec(db, sql_command, busy_roomsCallback, 0, &err_msg);
            break;

        case 2:
            rc = sqlite3_exec(db, sql_command, validEntryCallback, 0, &err_msg); 
            break;
    }

    #if VERBOSE_DEBUG
        printf("Thread #%d: Querying from database:\n   %s\n", thread_index, sql_command);
    #endif


    if (rc != SQLITE_OK ) {
        fprintf(stderr, "Failed to select data\n");
        fprintf(stderr, "SQL error: %s\n", err_msg);

        sqlite3_free(err_msg);
        sqlite3_close(db);
        
        query->rv = -1;
        query->query_result = (void*)"";
        return query;
    } 

    sqlite3_close(db);


    // based on the query return the appropriate variable
    

    switch (query_id){
        case 0:

            // removing new line from last entry in list of entries (`view` response)
            query_result_g[strlen(query_result_g)-1] = '\0';

            query->rv = 0;
            query->query_result = (void*) query_result_g;
            break;
        
        case 1:
            query->rv = 0;
            query->query_result = (void*) rooms_busy_g;
            break;
        
        case 2:
            query->rv = 0;
            query->query_result = (void*) &entry_id_g;
            break;
    }

    return query;
}